

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::
PairMatcherImpl<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
::MatchAndExplain(PairMatcherImpl<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  *this,pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *a_pair,MatchResultListener *listener)

{
  ostream *poVar1;
  bool bVar2;
  StringMatchResultListener second_inner_listener;
  StringMatchResultListener first_inner_listener;
  string local_3a0;
  string local_380;
  MatchResultListener local_360;
  _func_int *local_350 [2];
  ostream local_340 [112];
  ios_base local_2d0 [264];
  MatchResultListener local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (listener->stream_ == (ostream *)0x0) {
    local_1c8.stream_ = (ostream *)0x0;
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_001bc270;
    bVar2 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::MatchAndExplain(&(this->first_matcher_).
                               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ,&a_pair->first,&local_1c8);
    if (bVar2) {
      local_1c8.stream_ = (ostream *)0x0;
      local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_001bc270;
      bVar2 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::MatchAndExplain(&(this->second_matcher_).
                                 super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                ,&a_pair->second,&local_1c8);
    }
    else {
      bVar2 = false;
    }
  }
  else {
    local_1c8.stream_ = local_1a8;
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_001bc2d8;
    std::__cxx11::stringstream::stringstream(local_1b8);
    bVar2 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::MatchAndExplain(&(this->first_matcher_).
                               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ,&a_pair->first,&local_1c8);
    if (bVar2) {
      local_360.stream_ = local_340;
      local_360._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_001bc2d8;
      std::__cxx11::stringstream::stringstream((stringstream *)local_350);
      bVar2 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::MatchAndExplain(&(this->second_matcher_).
                                 super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                ,&a_pair->second,&local_360);
      if (bVar2) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringbuf::str();
        ExplainSuccess(this,&local_3a0,&local_380,listener);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        MatchResultListener::operator<<(listener,(char (*) [34])"whose second field does not match")
        ;
        std::__cxx11::stringbuf::str();
        poVar1 = listener->stream_;
        if ((poVar1 != (ostream *)0x0) && (local_3a0._M_string_length != 0)) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      local_360._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_001bc2d8;
      std::__cxx11::stringstream::~stringstream((stringstream *)local_350);
      std::ios_base::~ios_base(local_2d0);
    }
    else {
      MatchResultListener::operator<<(listener,(char (*) [33])"whose first field does not match");
      std::__cxx11::stringbuf::str();
      poVar1 = listener->stream_;
      if ((poVar1 != (ostream *)0x0) && (local_360.stream_ != (ostream *)0x0)) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,(char *)local_360._vptr_MatchResultListener,(long)local_360.stream_);
      }
      if (local_360._vptr_MatchResultListener != local_350) {
        operator_delete(local_360._vptr_MatchResultListener,(ulong)(local_350[0] + 1));
      }
      bVar2 = false;
    }
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_001bc2d8;
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return bVar2;
}

Assistant:

bool MatchAndExplain(PairType a_pair,
                       MatchResultListener* listener) const override {
    if (!listener->IsInterested()) {
      // If the listener is not interested, we don't need to construct the
      // explanation.
      return first_matcher_.Matches(pair_getters::First(a_pair, Rank1())) &&
             second_matcher_.Matches(pair_getters::Second(a_pair, Rank1()));
    }
    StringMatchResultListener first_inner_listener;
    if (!first_matcher_.MatchAndExplain(pair_getters::First(a_pair, Rank1()),
                                        &first_inner_listener)) {
      *listener << "whose first field does not match";
      PrintIfNotEmpty(first_inner_listener.str(), listener->stream());
      return false;
    }
    StringMatchResultListener second_inner_listener;
    if (!second_matcher_.MatchAndExplain(pair_getters::Second(a_pair, Rank1()),
                                         &second_inner_listener)) {
      *listener << "whose second field does not match";
      PrintIfNotEmpty(second_inner_listener.str(), listener->stream());
      return false;
    }
    ExplainSuccess(first_inner_listener.str(), second_inner_listener.str(),
                   listener);
    return true;
  }